

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.h
# Opt level: O0

InlineeFrameInfo * InlineeFrameInfo::New(JitArenaAllocator *alloc)

{
  InlineeFrameInfo *this;
  JitArenaAllocator *pJVar1;
  InlineeFrameInfo *this_00;
  List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  TrackAllocData local_78;
  code *local_50;
  undefined8 local_48;
  TrackAllocData local_40;
  InlineeFrameInfo *local_18;
  InlineeFrameInfo *frameInfo;
  JitArenaAllocator *alloc_local;
  
  frameInfo = (InlineeFrameInfo *)alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
             ,0xa1);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          alloc,&local_40);
  local_50 = Memory::JitArenaAllocator::AllocZero;
  local_48 = 0;
  this_00 = (InlineeFrameInfo *)new<Memory::JitArenaAllocator>(0x50,pJVar1,0x4e9be0);
  InlineeFrameInfo(this_00);
  this = frameInfo;
  local_18 = this_00;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,
             (type_info *)
             &JsUtil::
              List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
             ,0xa2);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this
                          ,&local_78);
  this_01 = (List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::JitArenaAllocator>(0x30,pJVar1,0x4e98c0);
  JsUtil::
  List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::List(this_01,(JitArenaAllocator *)frameInfo,4);
  local_18->arguments = this_01;
  return local_18;
}

Assistant:

static InlineeFrameInfo* New(JitArenaAllocator* alloc)
    {
        InlineeFrameInfo* frameInfo = JitAnewStructZ(alloc, InlineeFrameInfo);
        frameInfo->arguments = JitAnew(alloc, ArgList, alloc);
        return frameInfo;
    }